

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Preprocessor::handleDefineDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  Token *pTVar2;
  flat_hash_map<std::string_view,_MacroDef> *arrays_;
  size_t *psVar3;
  group_type_pointer pgVar4;
  undefined8 uVar5;
  BumpAllocator *pBVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  bool bVar13;
  bool bVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  DefineDirectiveSyntax *this_00;
  pointer pTVar18;
  value_type *pvVar19;
  Preprocessor *__n;
  bool bVar20;
  char cVar21;
  SyntaxKind SVar22;
  int iVar23;
  ulong uVar24;
  undefined4 extraout_var;
  uint64_t uVar25;
  Diagnostic *this_01;
  SourceLocation SVar26;
  uint uVar27;
  Info *extraout_RDX;
  __extent_storage<18446744073709551615UL> _Var28;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  Info *pIVar29;
  Info *extraout_RDX_05;
  Info *extraout_RDX_06;
  pointer extraout_RDX_07;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  Trivia *trivia;
  Trivia *this_02;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  Token TVar38;
  string_view sVar39;
  string_view sVar40;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar41;
  SourceRange SVar42;
  string_view rawText;
  try_emplace_args_t local_121;
  DefineDirectiveSyntax *local_120;
  pointer local_118;
  value_type *elements;
  Token local_108;
  Token t;
  MacroParser parser;
  MacroFormalArgumentListSyntax *formalArguments;
  long local_68;
  size_t local_60;
  char *pcStack_58;
  Token directive_local;
  Trivia local_40;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  formalArguments = (MacroFormalArgumentListSyntax *)0x0;
  Token::Token(&local_108);
  if ((this->currentToken).info == (Info *)0x0) {
    TVar38 = nextProcessed(this);
    this->currentToken = TVar38;
  }
  local_118 = &this->currentToken;
  bVar20 = LexerFacts::isKeyword((this->currentToken).kind);
  if (bVar20) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar38 = nextProcessed(this);
      this->currentToken = TVar38;
    }
    pTVar18 = local_118;
    TVar38 = this->currentToken;
    uVar15 = local_118->field_0x2;
    NVar16.raw = (local_118->numFlags).raw;
    uVar17 = local_118->rawLen;
    pIVar29 = local_118->info;
    (this->lastConsumed).kind = local_118->kind;
    (this->lastConsumed).field_0x2 = uVar15;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar16.raw;
    (this->lastConsumed).rawLen = uVar17;
    (this->lastConsumed).info = pIVar29;
    Token::Token((Token *)&parser);
    *(Preprocessor **)pTVar18 = parser.pp;
    pTVar18->info = (Info *)parser.buffer._M_ptr;
    _Var28._M_extent_value = (size_t)extraout_RDX;
  }
  else {
    TVar38 = expect(this,Identifier);
    _Var28._M_extent_value = (size_t)TVar38.info;
  }
  this->inMacroBody = true;
  uVar35 = (undefined4)CONCAT71(TVar38._1_7_,1);
  local_108 = TVar38;
  if (((undefined1  [16])TVar38 & (undefined1  [16])0x10000) == (undefined1  [16])0x0) {
    sVar39 = Token::valueText(&local_108);
    bVar20 = (this->lexerOptions).enableLegacyProtect;
    sVar40._M_str._0_1_ = bVar20;
    sVar40._M_len = (size_t)sVar39._M_str;
    sVar40._M_str._1_7_ = 0;
    SVar22 = LexerFacts::getDirectiveKind((LexerFacts *)sVar39._M_len,sVar40,bVar20);
    if (SVar22 == MacroUsage) {
      uVar35 = 0;
      _Var28._M_extent_value = (size_t)extraout_RDX_00;
    }
    else {
      SVar42 = Token::range(&local_108);
      Diagnostics::add(this->diagnostics,(DiagCode)0xd0004,SVar42);
      uVar35 = (undefined4)CONCAT71(TVar38._1_7_,1);
      _Var28._M_extent_value = (size_t)extraout_RDX_01;
    }
    if ((this->currentToken).info == (Info *)0x0) {
      TVar38 = nextProcessed(this);
      _Var28._M_extent_value = (size_t)TVar38.info;
      this->currentToken = TVar38;
    }
    if (local_118->kind == OpenParenthesis) {
      sVar40 = Token::rawText(&local_108);
      if (sVar40._M_len == 0) {
        bVar20 = false;
      }
      else {
        sVar40 = Token::rawText(&local_108);
        bVar20 = *sVar40._M_str == '\\';
      }
      if ((this->currentToken).info == (Info *)0x0) {
        TVar38 = nextProcessed(this);
        this->currentToken = TVar38;
      }
      parser._0_16_ = this->currentToken;
      sVar41 = Token::trivia((Token *)&parser);
      _Var28 = sVar41._M_extent._M_extent_value;
      if ((Info *)_Var28._M_extent_value == (Info *)0x0) {
LAB_0014c9c1:
        parser.buffer._M_ptr = (pointer)0x0;
        parser.pp = this;
        parser.buffer._M_extent._M_extent_value = 0;
        parser.currentIndex = 0;
        formalArguments = MacroParser::parseFormalArgumentList(&parser);
        _Var28._M_extent_value = (size_t)extraout_RDX_02;
      }
      else if (bVar20 && (Info *)_Var28._M_extent_value == (Info *)0x1) {
        sVar40 = Trivia::getRawText(sVar41._M_ptr);
        _Var28._M_extent_value = (size_t)sVar40._M_str;
        if ((sVar40._M_len == 1) &&
           (iVar23 = bcmp((void *)_Var28._M_extent_value," ",1),
           _Var28._M_extent_value = (size_t)extraout_RDX_03, iVar23 == 0)) goto LAB_0014c9c1;
      }
    }
  }
  elements = (value_type *)CONCAT44(elements._4_4_,uVar35);
  local_120 = (DefineDirectiveSyntax *)&this->scratchTokenBuffer;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  pTVar1 = &this->lastConsumed;
  bVar20 = false;
  do {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar38 = nextProcessed(this);
      _Var28._M_extent_value = (size_t)TVar38.info;
      this->currentToken = TVar38;
    }
    pTVar2 = &this->currentToken;
    uVar5._0_2_ = pTVar2->kind;
    uVar5._2_1_ = pTVar2->field_0x2;
    uVar5._3_1_ = pTVar2->numFlags;
    uVar5._4_4_ = pTVar2->rawLen;
    t = *pTVar2;
    uVar27 = (uint)uVar5 & 0xffff;
    bVar13 = true;
    if (uVar27 != 1) {
      if (uVar27 == 0x15f) {
        if ((this->currentToken).info == (Info *)0x0) {
          TVar38 = nextProcessed(this);
          this->currentToken = TVar38;
        }
        pTVar18 = local_118;
        TVar38 = this->currentToken;
        uVar15 = local_118->field_0x2;
        NVar16.raw = (local_118->numFlags).raw;
        uVar17 = local_118->rawLen;
        pIVar29 = local_118->info;
        pTVar1->kind = local_118->kind;
        pTVar1->field_0x2 = uVar15;
        pTVar1->numFlags = (NumericTokenFlags)NVar16.raw;
        pTVar1->rawLen = uVar17;
        (this->lastConsumed).info = pIVar29;
        Token::Token((Token *)&parser);
        *(Preprocessor **)pTVar18 = parser.pp;
        pTVar18->info = (Info *)parser.buffer._M_ptr;
        parser._0_16_ = TVar38;
        SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                  ((SmallVectorBase<slang::parsing::Token> *)local_120,(Token *)&parser);
        bVar13 = false;
        bVar20 = false;
        _Var28._M_extent_value = (size_t)extraout_RDX_04;
      }
      else {
        sVar41 = Token::trivia(&t);
        if (sVar41._M_extent._M_extent_value._M_extent_value == 0) {
          bVar14 = false;
          _Var28._M_extent_value = 0;
        }
        else {
          lVar31 = sVar41._M_extent._M_extent_value._M_extent_value * 0x10;
          bVar14 = false;
          do {
            lVar31 = lVar31 + -0x10;
            _Var28 = sVar41._M_extent._M_extent_value;
            this_02 = sVar41._M_ptr;
            if (this_02->kind == LineComment) {
              sVar40 = Trivia::getRawText(this_02);
              _Var28._M_extent_value = (size_t)sVar40._M_str;
              bVar20 = *(EVP_PKEY_CTX *)(_Var28._M_extent_value + (sVar40._M_len - 1)) ==
                       (EVP_PKEY_CTX)0x5c;
            }
            else if (this_02->kind == EndOfLine) {
              if (bVar20) {
                bVar20 = false;
              }
              else {
                bVar14 = true;
              }
            }
            else {
              bVar20 = false;
            }
          } while ((!bVar14) &&
                  (sVar41._M_extent._M_extent_value = _Var28._M_extent_value,
                  sVar41._M_ptr = this_02 + 1, lVar31 != 0));
        }
        if (!bVar14) {
          if ((this->currentToken).info == (Info *)0x0) {
            TVar38 = nextProcessed(this);
            this->currentToken = TVar38;
          }
          pTVar18 = local_118;
          uVar15 = local_118->field_0x2;
          NVar16.raw = (local_118->numFlags).raw;
          uVar17 = local_118->rawLen;
          pIVar29 = local_118->info;
          pTVar1->kind = local_118->kind;
          pTVar1->field_0x2 = uVar15;
          pTVar1->numFlags = (NumericTokenFlags)NVar16.raw;
          pTVar1->rawLen = uVar17;
          (this->lastConsumed).info = pIVar29;
          Token::Token((Token *)&parser);
          *(Preprocessor **)pTVar18 = parser.pp;
          pTVar18->info = (Info *)parser.buffer._M_ptr;
          if (t.kind == Identifier) {
            sVar40 = Token::rawText(&t);
            pIVar29 = (Info *)sVar40._M_str;
            uVar24 = sVar40._M_len;
            bVar13 = true;
            _Var28._M_extent_value = (size_t)pIVar29;
            if ((uVar24 != 0) &&
               (*(EVP_PKEY_CTX *)((long)pIVar29 + (uVar24 - 1)) == (EVP_PKEY_CTX)0x5c)) {
              if ((this->currentToken).info == (Info *)0x0) {
                TVar38 = nextProcessed(this);
                this->currentToken = TVar38;
              }
              parser._0_16_ = this->currentToken;
              sVar41 = Token::trivia((Token *)&parser);
              _Var28 = sVar41._M_extent._M_extent_value;
              if (((Info *)_Var28._M_extent_value != (Info *)0x0) &&
                 ((sVar41._M_ptr)->kind == EndOfLine)) {
                uVar30 = uVar24 - 1;
                if (uVar24 < uVar24 - 1) {
                  uVar30 = uVar24;
                }
                rawText._M_str = (char *)pIVar29;
                rawText._M_len = uVar30;
                parser._0_16_ = Token::withRawText(&t,this->alloc,rawText);
                this_00 = local_120;
                SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                          ((SmallVectorBase<slang::parsing::Token> *)local_120,(Token *)&parser);
                pBVar6 = this->alloc;
                local_60 = 1;
                pcStack_58 = "\\";
                SVar26 = Token::location(&t);
                bVar13 = false;
                sVar39._M_str = pcStack_58;
                sVar39._M_len = local_60;
                Token::Token((Token *)&parser,pBVar6,LineContinuation,
                             (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
                             sVar39,(SourceLocation)
                                    ((long)(((ulong)(uint)((int)((ulong)SVar26 >> 0x1c) +
                                                          (int)sVar40._M_len) << 0x20) +
                                           -0x100000000) >> 4 | (ulong)(SVar26._0_4_ & 0xfffffff)));
                SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                          ((SmallVectorBase<slang::parsing::Token> *)this_00,(Token *)&parser);
                bVar20 = true;
                _Var28._M_extent_value = (size_t)extraout_RDX_05;
              }
            }
            if (bVar13) goto LAB_0014cd27;
          }
          else {
LAB_0014cd27:
            SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                      ((SmallVectorBase<slang::parsing::Token> *)local_120,&t);
            _Var28._M_extent_value = (size_t)extraout_RDX_06;
          }
          bVar13 = false;
        }
      }
    }
  } while (!bVar13);
  this->inMacroBody = false;
  pBVar6 = this->alloc;
  parser.pp._0_4_ =
       SmallVectorBase<slang::parsing::Token>::copy
                 ((SmallVectorBase<slang::parsing::Token> *)local_120,(EVP_PKEY_CTX *)pBVar6,
                  (EVP_PKEY_CTX *)_Var28._M_extent_value);
  parser.pp._4_4_ = extraout_var;
  parser.buffer._M_ptr = extraout_RDX_07;
  local_120 = BumpAllocator::
              emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,std::span<slang::parsing::Token,18446744073709551615ul>>
                        (pBVar6,&directive_local,&local_108,&formalArguments,
                         (span<slang::parsing::Token,_18446744073709551615UL> *)&parser);
  arrays_ = &this->macros;
  parser._0_16_ = Token::valueText(&local_108);
  uVar25 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)arrays_,
                      (basic_string_view<char,_std::char_traits<char>_> *)&parser);
  uVar30 = uVar25 >> ((byte)(this->macros).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar7 = (this->macros).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
           .arrays.groups_;
  lVar31 = (uVar25 & 0xff) * 4;
  uVar9 = (&UNK_0051f39c)[lVar31];
  uVar10 = (&UNK_0051f39d)[lVar31];
  uVar11 = (&UNK_0051f39e)[lVar31];
  uVar12 = (&UNK_0051f39f)[lVar31];
  ppVar8 = (this->macros).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
           .arrays.elements_;
  __n = parser.pp;
  local_118 = parser.buffer._M_ptr;
  uVar24 = (this->macros).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
           .arrays.groups_size_mask;
  uVar33 = 0;
  do {
    pgVar4 = pgVar7 + uVar30;
    auVar36[0] = -(pgVar4->m[0].n == uVar9);
    auVar36[1] = -(pgVar4->m[1].n == uVar10);
    auVar36[2] = -(pgVar4->m[2].n == uVar11);
    auVar36[3] = -(pgVar4->m[3].n == uVar12);
    auVar36[4] = -(pgVar4->m[4].n == uVar9);
    auVar36[5] = -(pgVar4->m[5].n == uVar10);
    auVar36[6] = -(pgVar4->m[6].n == uVar11);
    auVar36[7] = -(pgVar4->m[7].n == uVar12);
    auVar36[8] = -(pgVar4->m[8].n == uVar9);
    auVar36[9] = -(pgVar4->m[9].n == uVar10);
    auVar36[10] = -(pgVar4->m[10].n == uVar11);
    auVar36[0xb] = -(pgVar4->m[0xb].n == uVar12);
    auVar36[0xc] = -(pgVar4->m[0xc].n == uVar9);
    auVar36[0xd] = -(pgVar4->m[0xd].n == uVar10);
    auVar36[0xe] = -(pgVar4->m[0xe].n == uVar11);
    auVar36[0xf] = -(pgVar4->m[0xf].n == uVar12);
    for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe); uVar27 != 0;
        uVar27 = uVar27 - 1 & uVar27) {
      iVar23 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> iVar23 & 1) == 0; iVar23 = iVar23 + 1) {
        }
      }
      bVar20 = __n == *(Preprocessor **)
                       ((long)&ppVar8[uVar30 * 0xf].first._M_len + (ulong)(uint)(iVar23 << 5));
      lVar31 = (long)&ppVar8[uVar30 * 0xf].first._M_len + (ulong)(uint)(iVar23 << 5);
      if (bVar20 && __n != (Preprocessor *)0x0) {
        iVar23 = bcmp(local_118,*(void **)(lVar31 + 8),(size_t)__n);
        bVar20 = iVar23 == 0;
      }
      if (bVar20) goto LAB_0014cf3f;
    }
    if ((pgVar7[uVar30].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar25 & 7]) == 0) break;
    lVar31 = uVar30 + uVar33;
    uVar33 = uVar33 + 1;
    uVar30 = lVar31 + 1U & uVar24;
  } while (uVar33 <= uVar24);
  lVar31 = 0;
LAB_0014cf3f:
  if (lVar31 != 0) {
    if (*(char *)(lVar31 + 0x1c) == '\x01') {
      SVar42 = Token::range(&local_108);
      Diagnostics::add(this->diagnostics,(DiagCode)0xd0004,SVar42);
      cVar21 = '\x01';
      goto LAB_0014cffb;
    }
    cVar21 = '\x01';
    if (((*(char *)(lVar31 + 0x1d) != '\0') || (cVar21 = (char)elements, cVar21 != '\0')) ||
       ((*(DefineDirectiveSyntax **)(lVar31 + 0x10) == (DefineDirectiveSyntax *)0x0 &&
        (*(int *)(lVar31 + 0x18) == 0)))) goto LAB_0014cffb;
    bVar20 = isSameMacro(local_120,*(DefineDirectiveSyntax **)(lVar31 + 0x10));
    if (!bVar20) {
      SVar42 = Token::range(&local_108);
      this_01 = Diagnostics::add(this->diagnostics,(DiagCode)0x290004,SVar42);
      sVar40 = Token::valueText(&local_108);
      Diagnostic::operator<<(this_01,sVar40);
      SVar26 = Token::location((Token *)(*(long *)(lVar31 + 0x10) + 0x28));
      Diagnostic::addNote(this_01,(DiagCode)0xa0001,SVar26);
    }
  }
  cVar21 = (char)elements;
LAB_0014cffb:
  if (cVar21 == '\0') {
    t = (Token)Token::valueText(&local_108);
    uVar25 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)arrays_
                        ,(basic_string_view<char,_std::char_traits<char>_> *)&t);
    uVar33 = uVar25 >> ((byte)(this->macros).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                              .arrays.groups_size_index & 0x3f);
    pgVar7 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_;
    lVar31 = (uVar25 & 0xff) * 4;
    uVar9 = (&UNK_0051f39c)[lVar31];
    uVar10 = (&UNK_0051f39d)[lVar31];
    uVar11 = (&UNK_0051f39e)[lVar31];
    uVar12 = (&UNK_0051f39f)[lVar31];
    elements = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.elements_;
    uVar5 = t._0_8_;
    local_118 = (pointer)t.info;
    uVar24 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_size_mask;
    uVar34 = 0;
    uVar30 = uVar33;
    do {
      pvVar19 = elements;
      pgVar4 = pgVar7 + uVar30;
      auVar37[0] = -(pgVar4->m[0].n == uVar9);
      auVar37[1] = -(pgVar4->m[1].n == uVar10);
      auVar37[2] = -(pgVar4->m[2].n == uVar11);
      auVar37[3] = -(pgVar4->m[3].n == uVar12);
      auVar37[4] = -(pgVar4->m[4].n == uVar9);
      auVar37[5] = -(pgVar4->m[5].n == uVar10);
      auVar37[6] = -(pgVar4->m[6].n == uVar11);
      auVar37[7] = -(pgVar4->m[7].n == uVar12);
      auVar37[8] = -(pgVar4->m[8].n == uVar9);
      auVar37[9] = -(pgVar4->m[9].n == uVar10);
      auVar37[10] = -(pgVar4->m[10].n == uVar11);
      auVar37[0xb] = -(pgVar4->m[0xb].n == uVar12);
      auVar37[0xc] = -(pgVar4->m[0xc].n == uVar9);
      auVar37[0xd] = -(pgVar4->m[0xd].n == uVar10);
      auVar37[0xe] = -(pgVar4->m[0xe].n == uVar11);
      auVar37[0xf] = -(pgVar4->m[0xf].n == uVar12);
      lVar32 = uVar30 * 0x10;
      lVar31 = local_68;
      for (uVar27 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe); local_68 = lVar32
          , uVar27 != 0; uVar27 = uVar27 - 1 & uVar27) {
        iVar23 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> iVar23 & 1) == 0; iVar23 = iVar23 + 1) {
          }
        }
        bVar20 = uVar5 == *(long *)((long)&pvVar19[uVar30 * 0xf].first._M_len +
                                   (ulong)(uint)(iVar23 << 5));
        _Var28._M_extent_value =
             (long)&pvVar19[uVar30 * 0xf].first._M_len + (ulong)(uint)(iVar23 << 5);
        if (bVar20 && uVar5 != 0) {
          iVar23 = bcmp(local_118,*(void **)(_Var28._M_extent_value + 8),uVar5);
          bVar20 = iVar23 == 0;
        }
        if (bVar20) goto LAB_0014d1ef;
        lVar32 = local_68;
        lVar31 = local_68;
      }
      if ((pgVar7->m[local_68 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar25 & 7]) == 0) break;
      lVar32 = uVar30 + uVar34;
      uVar34 = uVar34 + 1;
      uVar30 = lVar32 + 1U & uVar24;
      local_68 = lVar31;
    } while (uVar34 <= uVar24);
    _Var28._M_extent_value = 0;
    local_68 = lVar31;
LAB_0014d1ef:
    if (_Var28._M_extent_value == 0) {
      if ((this->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.size <
          (this->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                  ((locator *)&parser,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)arrays_,(arrays_type *)arrays_,uVar33,uVar25,&local_121,
                   (basic_string_view<char,_std::char_traits<char>_> *)&t);
        psVar3 = &(this->macros).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  .size_ctrl.size;
        *psVar3 = *psVar3 + 1;
        _Var28 = parser.buffer._M_extent;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                  ((locator *)&parser,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)arrays_,uVar25,&local_121,
                   (basic_string_view<char,_std::char_traits<char>_> *)&t);
        _Var28 = parser.buffer._M_extent;
      }
    }
    *(DefineDirectiveSyntax **)(_Var28._M_extent_value + 0x10) = local_120;
    *(undefined4 *)(_Var28._M_extent_value + 0x18) = 0;
    *(undefined2 *)(_Var28._M_extent_value + 0x1c) = 0;
  }
  Trivia::Trivia(&local_40,Directive,(SyntaxNode *)local_120);
  return local_40;
}

Assistant:

Trivia Preprocessor::handleDefineDirective(Token directive) {
    MacroFormalArgumentListSyntax* formalArguments = nullptr;
    bool bad = false;

    // Next token should be the macro name. We allow the name to be
    // a keyword token for compatibility with other tools.
    Token name;
    if (LF::isKeyword(peek().kind))
        name = consume();
    else
        name = expect(TokenKind::Identifier);

    inMacroBody = true;
    if (name.isMissing())
        bad = true;
    else {
        if (LF::getDirectiveKind(name.valueText(), lexerOptions.enableLegacyProtect) !=
            SyntaxKind::MacroUsage) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }

        // Check if this is a function-like macro, which requires an opening paren with no
        // leading space unless the macro name is escaped, in which case we have to allow one space.
        if (peek(TokenKind::OpenParenthesis)) {
            bool isEscaped = !name.rawText().empty() && name.rawText()[0] == '\\';
            auto trivia = peek().trivia();
            if (trivia.empty() ||
                (isEscaped && trivia.size() == 1 && trivia[0].getRawText() == " "sv)) {
                MacroParser parser(*this);
                formalArguments = parser.parseFormalArgumentList();
            }
        }
    }

    // consume all remaining tokens as macro text
    scratchTokenBuffer.clear();
    bool hasContinuation = false;
    while (true) {
        // Figure out when to stop consuming macro text. This involves looking for new lines in the
        // trivia of each token as we grab it. If there's a new line without a preceeding line
        // continuation token we know the macro is finished.
        Token t = peek();
        if (t.kind == TokenKind::EndOfFile)
            break;
        if (t.kind == TokenKind::LineContinuation) {
            hasContinuation = false;
            scratchTokenBuffer.push_back(consume());
            continue;
        }

        bool done = false;
        auto triviaList = t.trivia();
        for (const Trivia& trivia : triviaList) {
            switch (trivia.kind) {
                case TriviaKind::EndOfLine:
                    if (hasContinuation)
                        hasContinuation = false;
                    else
                        done = true;
                    break;
                case TriviaKind::LineComment:
                    // A line comment can have a trailing line continuation.
                    hasContinuation = (trivia.getRawText().back() == '\\');
                    break;
                default:
                    hasContinuation = false;
                    break;
            }
            if (done)
                break;
        }
        if (done)
            break;

        consume();

        if (t.kind == TokenKind::Identifier) {
            // Escaped identifiers that end in a backslash act as a continuation.
            auto raw = t.rawText();
            if (!raw.empty() && raw.back() == '\\') {
                auto nextTrivia = peek().trivia();
                if (!nextTrivia.empty() && nextTrivia[0].kind == TriviaKind::EndOfLine) {
                    hasContinuation = true;
                    scratchTokenBuffer.push_back(
                        t.withRawText(alloc, raw.substr(0, raw.size() - 1)));
                    scratchTokenBuffer.push_back(Token(alloc, TokenKind::LineContinuation, {}, "\\",
                                                       t.location() + raw.size() - 1));
                    continue;
                }
            }
        }

        scratchTokenBuffer.push_back(t);
    }
    inMacroBody = false;

    auto result = alloc.emplace<DefineDirectiveSyntax>(directive, name, formalArguments,
                                                       scratchTokenBuffer.copy(alloc));

    if (auto it = macros.find(name.valueText()); it != macros.end()) {
        if (it->second.builtIn) {
            addDiag(diag::InvalidMacroName, name.range());
            bad = true;
        }
        else if (it->second.commandLine)
            bad = true; // not really bad, but commandLine args has precedence so we skip this
        else if (!bad && it->second.valid() && !isSameMacro(*result, *it->second.syntax)) {
            auto& diag = addDiag(diag::RedefiningMacro, name.range());
            diag << name.valueText();
            diag.addNote(diag::NotePreviousDefinition, it->second.syntax->name.location());
        }
    }

    if (!bad)
        macros[name.valueText()] = result;
    return Trivia(TriviaKind::Directive, result);
}